

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void getPosFloatOrInf(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  char *__s1;
  int iVar1;
  ostream *poVar2;
  invalid_argument *piVar3;
  Attribute *pAVar4;
  double dVar5;
  float f;
  stringstream e;
  allocator<char> local_1d5;
  float local_1d4;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  int local_190;
  Attribute *local_188;
  
  if (argc + -2 < *i) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"Expected a positive float (or \"infinity\")");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __s1 = argv[(long)*i + 1];
  iVar1 = strcmp(__s1,"inf");
  if (iVar1 != 0) {
    iVar1 = strcmp(__s1,"infinity");
    if (iVar1 != 0) {
      dVar5 = strtod(__s1,(char **)0x0);
      local_1d4 = (float)dVar5;
      if (local_1d4 <= 0.0) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 0x10),"The value for the ",0x12);
        poVar2 = std::operator<<((ostream *)(local_1b0 + 0x10),attrName);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2," attribute must be greater than zero, or \"infinity\"",0x33);
        piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(piVar3,(string *)&local_1d0);
        __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      goto LAB_00104091;
    }
  }
  local_1d4 = *(float *)(_imath_half_to_float_table + 0x1f000);
LAB_00104091:
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,attrName,&local_1d5);
  pAVar4 = (Attribute *)operator_new(0x10);
  Imf_3_2::TypedAttribute<float>::TypedAttribute((float *)pAVar4);
  local_1b0._0_8_ = local_1b0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b0,local_1d0,local_1c8 + (long)local_1d0);
  local_190 = part;
  local_188 = pAVar4;
  std::vector<SetAttr,_std::allocator<SetAttr>_>::emplace_back<SetAttr>(attrs,(SetAttr *)local_1b0);
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  *i = *i + 2;
  return;
}

Assistant:

void
getPosFloatOrInf (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs)
{
    if (i > argc - 2)
        throw invalid_argument("Expected a positive float (or \"infinity\")");
    
    float f;

    if (!strcmp (argv[i + 1], "inf") || !strcmp (argv[i + 1], "infinity"))
    {
        f = float (half::posInf ());
    }
    else
    {
        f = static_cast<float> (strtod (argv[i + 1], 0));

        if (f <= 0)
        {
            std::stringstream e;
            e << "The value for the " << attrName
              << " attribute must be greater than zero, or \"infinity\"";
            throw invalid_argument(e.str());
        }
    }

    attrs.push_back (SetAttr (attrName, part, new FloatAttribute (f)));
    i += 2;
}